

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

void vkt::memory::anon_unknown_0::randomRanges
               (Random *rng,
               vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *ranges,
               size_t count,VkDeviceMemory memory,VkDeviceSize minOffset,VkDeviceSize maxSize,
               VkDeviceSize atomSize)

{
  pointer pVVar1;
  VkDeviceSize VVar2;
  VkDeviceSize VVar3;
  long lVar4;
  bool bVar5;
  
  std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::resize
            (ranges,count);
  lVar4 = 0x20;
  while (bVar5 = count != 0, count = count - 1, bVar5) {
    VVar2 = randomSize(rng,atomSize,maxSize);
    VVar3 = randomOffset(rng,atomSize,maxSize - VVar2);
    pVVar1 = (ranges->
             super__Vector_base<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar1 + lVar4 + -0x20) = 6;
    *(undefined8 *)((long)pVVar1 + lVar4 + -0x18) = 0;
    *(deUint64 *)((long)pVVar1 + lVar4 + -0x10) = memory.m_internal;
    *(VkDeviceSize *)((long)pVVar1 + lVar4 + -8) = VVar3 + minOffset;
    *(VkDeviceSize *)((long)&pVVar1->sType + lVar4) = VVar2;
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void randomRanges (de::Random& rng, vector<VkMappedMemoryRange>& ranges, size_t count, VkDeviceMemory memory, VkDeviceSize minOffset, VkDeviceSize maxSize, VkDeviceSize atomSize)
{
	ranges.resize(count);

	for (size_t rangeNdx = 0; rangeNdx < count; rangeNdx++)
	{
		const VkDeviceSize	size	= randomSize(rng, atomSize, maxSize);
		const VkDeviceSize	offset	= minOffset + randomOffset(rng, atomSize, maxSize - size);

		const VkMappedMemoryRange range =
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,

			memory,
			offset,
			size
		};
		ranges[rangeNdx] = range;
	}
}